

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

bool __thiscall PStruct::ReadFields(PStruct *this,FSerializer *ar,void *addr)

{
  bool bVar1;
  byte bVar2;
  char *text;
  DObject *this_00;
  char *pcVar3;
  byte bVar4;
  char *format;
  byte local_48;
  FName local_44;
  void *local_40;
  PSymbolTable *local_38;
  
  local_38 = &(this->super_PNamedType).super_PCompoundType.super_PType.Symbols;
  bVar4 = 1;
  local_48 = 0;
  local_40 = addr;
  do {
    while( true ) {
      text = FSerializer::GetKey(ar);
      if (text == (char *)0x0) {
        return (bool)(bVar4 | local_48 & 1);
      }
      local_44.Index = FName::NameManager::FindName(&FName::NameData,text,true);
      this_00 = (DObject *)PSymbolTable::FindSymbol(local_38,&local_44,true);
      if (this_00 != (DObject *)0x0) break;
      pcVar3 = FName::NameData.NameArray[(this->super_PNamedType).TypeName.Index].Text;
      format = "Cannot find field %s in %s\n";
LAB_003960e2:
      bVar4 = 0;
      DPrintf(1,format,text,pcVar3);
    }
    bVar1 = DObject::IsKindOf(this_00,PField::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = FName::NameData.NameArray[(this->super_PNamedType).TypeName.Index].Text;
      format = "Symbol %s in %s is not a field\n";
      goto LAB_003960e2;
    }
    bVar4 = 0;
    bVar2 = (**(code **)(*(long *)&((this_00[1].Class)->super_PNativeStruct).super_PStruct.
                                   super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase.
                                   super_DObject + 0x50))
                      (this_00[1].Class,ar,0,(long)this_00[1]._vptr_DObject + (long)local_40);
    local_48 = local_48 | bVar2;
  } while( true );
}

Assistant:

bool PStruct::ReadFields(FSerializer &ar, void *addr) const
{
	bool readsomething = false;
	bool foundsomething = false;
	const char *label;
	while ((label = ar.GetKey()))
	{
		foundsomething = true;

		const PSymbol *sym = Symbols.FindSymbol(FName(label, true), true);
		if (sym == NULL)
		{
			DPrintf(DMSG_ERROR, "Cannot find field %s in %s\n",
				label, TypeName.GetChars());
		}
		else if (!sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			DPrintf(DMSG_ERROR, "Symbol %s in %s is not a field\n",
				label, TypeName.GetChars());
		}
		else
		{
			readsomething |= static_cast<const PField *>(sym)->Type->ReadValue(ar, nullptr,
				(BYTE *)addr + static_cast<const PField *>(sym)->Offset);
		}
	}
	return readsomething || !foundsomething;
}